

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

string * get_next_arg(string *__return_storage_ptr__,int *i,int argc,char **argv,string *flag,
                     gpt_params *params)

{
  char *__s;
  result_type rVar1;
  string *psVar2;
  int iVar3;
  allocator<char> local_9;
  
  iVar3 = *i + 1;
  if ((iVar3 < argc) && (__s = argv[(long)*i + 1], *__s != '-')) {
    *i = iVar3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_9);
    return __return_storage_ptr__;
  }
  get_next_arg();
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)argv);
  (flag->_M_dataplus)._M_p = (pointer)&flag->field_2;
  psVar2 = (string *)
           (*(code *)(&DAT_00120788 +
                     *(int *)(&DAT_00120788 + (rVar1 + (rVar1 / 5 & 0xfffffffffffffffe) * -5) * 4)))
                     ();
  return psVar2;
}

Assistant:

static std::string get_next_arg(int& i, int argc, char** argv, const std::string& flag, gpt_params& params) {
    if (i + 1 < argc && argv[i + 1][0] != '-') {
        return argv[++i];
    } else {
        fprintf(stderr, "error: %s requires one argument.\n", flag.c_str());
        gpt_print_usage(argc, argv, params);
        exit(0);
    }
}